

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetCursorScreenPos(ImVec2 *screen_pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  uint uVar6;
  ImVec2 IVar7;
  
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->Accessed = true;
  (pIVar5->DC).CursorPos = *screen_pos;
  fVar1 = (pIVar5->DC).CursorMaxPos.x;
  fVar2 = (pIVar5->DC).CursorMaxPos.y;
  fVar3 = (pIVar5->DC).CursorPos.x;
  fVar4 = (pIVar5->DC).CursorPos.y;
  uVar6 = -(uint)(fVar3 <= fVar1);
  IVar7.x = (float)(~uVar6 & (uint)fVar3 | (uint)fVar1 & uVar6);
  uVar6 = -(uint)(fVar4 <= fVar2);
  IVar7.y = (float)(~uVar6 & (uint)fVar4 | (uint)fVar2 & uVar6);
  (pIVar5->DC).CursorMaxPos = IVar7;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }